

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
          (ValueFlag<double,_args::ValueReader<double>_> *this)

{
  void *in_RDI;
  
  ~ValueFlag((ValueFlag<double,_args::ValueReader<double>_> *)0x124c38);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }